

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

bf_data bf_prep(uint32_t addr,int32_t ofs,uint32_t len)

{
  bf_data bVar1;
  uint32_t uVar2;
  uint uVar3;
  int local_28;
  int blen;
  int bofs;
  uint32_t len_local;
  int32_t ofs_local;
  uint32_t addr_local;
  
  uVar2 = (len - 1 & 0x1f) + 1;
  len_local = ofs / 8 + addr;
  local_28 = ofs % 8;
  if (local_28 < 0) {
    local_28 = local_28 + 8;
    len_local = len_local - 1;
  }
  uVar3 = local_28 + -1 + uVar2 >> 3;
  switch(uVar3) {
  case 0:
    local_28 = local_28 + 0x38;
    break;
  case 1:
    local_28 = local_28 + 0x30;
    break;
  case 2:
    if ((len_local & 1) != 0) {
      local_28 = local_28 + 8;
      len_local = len_local - 1;
    }
  case 3:
    local_28 = local_28 + 0x20;
    break;
  case 4:
    if ((len_local & 3) != 0) {
      local_28 = (len_local & 3) * 8 + local_28;
      len_local = len_local & 0xfffffffc;
    }
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/op_helper.c"
               ,0x2f9,(char *)0x0);
  }
  bVar1.bofs = local_28;
  bVar1.addr = len_local;
  bVar1.blen = uVar3;
  bVar1.len = uVar2;
  return bVar1;
}

Assistant:

static struct bf_data bf_prep(uint32_t addr, int32_t ofs, uint32_t len)
{
    int bofs, blen;

    /* Bound length; map 0 to 32.  */
    len = ((len - 1) & 31) + 1;

    /* Note that ofs is signed.  */
    addr += ofs / 8;
    bofs = ofs % 8;
    if (bofs < 0) {
        bofs += 8;
        addr -= 1;
    }

    /*
     * Compute the number of bytes required (minus one) to
     * satisfy the bitfield.
     */
    blen = (bofs + len - 1) / 8;

    /*
     * Canonicalize the bit offset for data loaded into a 64-bit big-endian
     * word.  For the cases where BLEN is not a power of 2, adjust ADDR so
     * that we can use the next power of two sized load without crossing a
     * page boundary, unless the field itself crosses the boundary.
     */
    switch (blen) {
    case 0:
        bofs += 56;
        break;
    case 1:
        bofs += 48;
        break;
    case 2:
        if (addr & 1) {
            bofs += 8;
            addr -= 1;
        }
        /* fallthru */
    case 3:
        bofs += 32;
        break;
    case 4:
        if (addr & 3) {
            bofs += 8 * (addr & 3);
            addr &= -4;
        }
        break;
    default:
        g_assert_not_reached();
    }

    return (struct bf_data){
        .addr = addr,
        .bofs = bofs,
        .blen = blen,
        .len = len,
    };
}